

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O0

void __thiscall twitter::zipkin::thrift::Span::printTo(Span *this,ostream *out)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string local_188;
  byte local_161;
  string local_160;
  byte local_139;
  string local_138;
  byte local_111;
  string local_110;
  string local_f0;
  string local_d0;
  byte local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_38;
  ostream *local_18;
  ostream *out_local;
  Span *this_local;
  
  local_18 = out;
  out_local = (ostream *)this;
  std::operator<<(out,"Span(");
  poVar1 = std::operator<<(local_18,"trace_id=");
  apache::thrift::to_string<long>(&local_38,&this->trace_id);
  std::operator<<(poVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<(local_18,", ");
  poVar1 = std::operator<<(poVar1,"name=");
  apache::thrift::to_string<std::__cxx11::string>(&local_68,(thrift *)&this->name,t);
  std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar1 = std::operator<<(local_18,", ");
  poVar1 = std::operator<<(poVar1,"id=");
  apache::thrift::to_string<long>(&local_88,&this->id);
  std::operator<<(poVar1,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"parent_id=");
  poVar1 = local_18;
  local_a9 = 0;
  if (((ushort)this->__isset >> 3 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string<long>(&local_a8,&this->parent_id);
    local_a9 = 1;
    std::operator<<(poVar1,(string *)&local_a8);
  }
  if ((local_a9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  poVar1 = std::operator<<(local_18,", ");
  poVar1 = std::operator<<(poVar1,"annotations=");
  apache::thrift::to_string<twitter::zipkin::thrift::Annotation>(&local_d0,&this->annotations);
  std::operator<<(poVar1,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  poVar1 = std::operator<<(local_18,", ");
  poVar1 = std::operator<<(poVar1,"binary_annotations=");
  apache::thrift::to_string<twitter::zipkin::thrift::BinaryAnnotation>
            (&local_f0,&this->binary_annotations);
  std::operator<<(poVar1,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"debug=");
  poVar1 = local_18;
  local_111 = 0;
  if (((ushort)this->__isset >> 6 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string<bool>(&local_110,&this->debug);
    local_111 = 1;
    std::operator<<(poVar1,(string *)&local_110);
  }
  if ((local_111 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_110);
  }
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"timestamp=");
  poVar1 = local_18;
  local_139 = 0;
  if (((ushort)this->__isset >> 7 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string<long>(&local_138,&this->timestamp);
    local_139 = 1;
    std::operator<<(poVar1,(string *)&local_138);
  }
  if ((local_139 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_138);
  }
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"duration=");
  poVar1 = local_18;
  local_161 = 0;
  if (((ushort)this->__isset >> 8 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string<long>(&local_160,&this->duration);
    local_161 = 1;
    std::operator<<(poVar1,(string *)&local_160);
  }
  if ((local_161 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_160);
  }
  poVar1 = std::operator<<(local_18,", ");
  std::operator<<(poVar1,"trace_id_high=");
  poVar1 = local_18;
  if (((ushort)this->__isset >> 9 & 1) == 0) {
    std::operator<<(local_18,"<null>");
  }
  else {
    apache::thrift::to_string<long>(&local_188,&this->trace_id_high);
    std::operator<<(poVar1,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
  }
  std::operator<<(local_18,")");
  return;
}

Assistant:

void Span::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "Span(";
  out << "trace_id=" << to_string(trace_id);
  out << ", " << "name=" << to_string(name);
  out << ", " << "id=" << to_string(id);
  out << ", " << "parent_id="; (__isset.parent_id ? (out << to_string(parent_id)) : (out << "<null>"));
  out << ", " << "annotations=" << to_string(annotations);
  out << ", " << "binary_annotations=" << to_string(binary_annotations);
  out << ", " << "debug="; (__isset.debug ? (out << to_string(debug)) : (out << "<null>"));
  out << ", " << "timestamp="; (__isset.timestamp ? (out << to_string(timestamp)) : (out << "<null>"));
  out << ", " << "duration="; (__isset.duration ? (out << to_string(duration)) : (out << "<null>"));
  out << ", " << "trace_id_high="; (__isset.trace_id_high ? (out << to_string(trace_id_high)) : (out << "<null>"));
  out << ")";
}